

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# app.cpp
# Opt level: O0

void __thiscall App::drawBoundaries(App *this,Graphics *g)

{
  Graphics *this_00;
  reference pvVar1;
  anon_union_16_4_ea85571f_for_vec<4,_float,_(glm::qualifier)0>_3 local_28;
  Graphics *local_18;
  Graphics *g_local;
  App *this_local;
  
  local_18 = g;
  g_local = (Graphics *)this;
  piksel::Graphics::push(g);
  piksel::Graphics::rectMode(local_18,CORNERS);
  this_00 = local_18;
  glm::vec<4,_float,_(glm::qualifier)0>::vec
            ((vec<4,_float,_(glm::qualifier)0> *)&local_28.field_0,0.5568628,0.5568628,0.5568628,1.0
            );
  piksel::Graphics::fill(this_00,(vec4)local_28);
  piksel::Graphics::noStroke(local_18);
  piksel::Graphics::rect(local_18,0.0,32.0,(float)(this->super_BaseApp).width,64.0);
  piksel::Graphics::rect(local_18,0.0,64.0,32.0,(float)(this->super_BaseApp).height);
  piksel::Graphics::rect
            (local_18,(float)(this->super_BaseApp).width - 32.0,64.0,
             (float)(this->super_BaseApp).width,(float)(this->super_BaseApp).height);
  piksel::Graphics::imageMode(local_18,CORNER);
  pvVar1 = std::vector<piksel::Sprite,_std::allocator<piksel::Sprite>_>::operator[]
                     (&(this->spritesheet).sprites,0x26);
  piksel::Sprite::draw(pvVar1,local_18,0.0,140.0,32.0,32.0,true,false,false);
  pvVar1 = std::vector<piksel::Sprite,_std::allocator<piksel::Sprite>_>::operator[]
                     (&(this->spritesheet).sprites,0x26);
  piksel::Sprite::draw
            (pvVar1,local_18,(float)((this->super_BaseApp).width + -0x20),140.0,32.0,32.0,false,
             false,false);
  piksel::Graphics::pop(local_18);
  return;
}

Assistant:

void App::drawBoundaries(piksel::Graphics& g) {
    g.push();
    g.rectMode(piksel::DrawMode::CORNERS);
    g.fill(GRAY);
    g.noStroke();
    g.rect(0, BRICK_WIDTH, width, BRICK_WIDTH + BRICK_WIDTH);
    g.rect(0, BRICK_WIDTH + BRICK_WIDTH, BRICK_WIDTH, height);
    g.rect(width - BRICK_WIDTH, BRICK_WIDTH + BRICK_WIDTH, width, height);
    g.imageMode(piksel::DrawMode::CORNER);
    spritesheet.sprites[38].draw(g, 0, BRICK_WIDTH + BRICK_WIDTH + 48 + 60 - 32, 32, 32, true);
    spritesheet.sprites[38].draw(g, width - 32, BRICK_WIDTH + BRICK_WIDTH + 48 + 60 - 32, 32, 32, false);
    g.pop();
}